

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEmbed.c
# Opt level: O0

Vec_Int_t * Emb_ManDumpGnuplotPrepare(Emb_Man_t *p)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  void *__ptr;
  void *__ptr_00;
  Vec_Int_t *p_00;
  bool bVar4;
  int fStart;
  int placeY;
  int placeX;
  int k;
  int i;
  char **ppRows;
  char *pBuffer;
  Emb_Obj_t *pThis;
  Vec_Int_t *vLines;
  int nCols;
  int nRows;
  Emb_Man_t *p_local;
  
  __ptr = calloc(0x55924,1);
  __ptr_00 = malloc(4000);
  for (placeX = 0; placeX < 500; placeX = placeX + 1) {
    *(long *)((long)__ptr_00 + (long)placeX * 8) = (long)__ptr + (long)(placeX * 0x2bd);
  }
  placeX = 0;
  while( true ) {
    bVar4 = false;
    if (placeX < p->nObjData) {
      pBuffer = (char *)Emb_ManObj(p,placeX);
      bVar4 = (Emb_Obj_t *)pBuffer != (Emb_Obj_t *)0x0;
    }
    if (!bVar4) break;
    uVar1 = ((uint)p->pPlacement[(uint)(*(int *)(pBuffer + 0x10) << 1)] * 700) / 0x10000;
    uVar2 = ((uint)p->pPlacement[*(int *)(pBuffer + 0x10) * 2 + 1] * 500) / 0x10000;
    if ((699 < uVar1) || (499 < uVar2)) {
      __assert_fail("placeX < nCols && placeY < nRows",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEmbed.c"
                    ,0x676,"Vec_Int_t *Emb_ManDumpGnuplotPrepare(Emb_Man_t *)");
    }
    *(undefined1 *)(*(long *)((long)__ptr_00 + (long)(int)uVar2 * 8) + (long)(int)uVar1) = 1;
    iVar3 = Emb_ObjSize((Emb_Obj_t *)pBuffer);
    placeX = iVar3 + placeX;
  }
  p_00 = Vec_IntAlloc(1000);
  placeX = 0;
  while( true ) {
    if (499 < placeX) {
      if (__ptr != (void *)0x0) {
        free(__ptr);
      }
      if (__ptr_00 != (void *)0x0) {
        free(__ptr_00);
      }
      return p_00;
    }
    bVar4 = false;
    for (placeY = 0; placeY < 0x2bd; placeY = placeY + 1) {
      if ((*(char *)(*(long *)((long)__ptr_00 + (long)placeX * 8) + (long)placeY) != '\0') &&
         (!bVar4)) {
        Vec_IntPush(p_00,placeY);
        Vec_IntPush(p_00,placeX);
        bVar4 = true;
      }
      if ((*(char *)(*(long *)((long)__ptr_00 + (long)placeX * 8) + (long)placeY) == '\0') &&
         (bVar4)) {
        Vec_IntPush(p_00,placeY + -1);
        Vec_IntPush(p_00,placeX);
        bVar4 = false;
      }
    }
    if (bVar4) break;
    placeX = placeX + 1;
  }
  __assert_fail("fStart == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEmbed.c"
                ,0x68d,"Vec_Int_t *Emb_ManDumpGnuplotPrepare(Emb_Man_t *)");
}

Assistant:

Vec_Int_t * Emb_ManDumpGnuplotPrepare( Emb_Man_t * p )
{
//    int nRows = 496;
//    int nCols = 710;
    int nRows = 500;
    int nCols = 700;
    Vec_Int_t * vLines;
    Emb_Obj_t * pThis;
    char * pBuffer, ** ppRows;
    int i, k, placeX, placeY;
    int fStart;
    // alloc memory
    pBuffer = ABC_CALLOC( char, nRows * (nCols+1) );
    ppRows  = ABC_ALLOC( char *, nRows );
    for ( i = 0; i < nRows; i++ )
        ppRows[i] = pBuffer + i*(nCols+1);
    // put data into them
    Emb_ManForEachObj( p, pThis, i )
    {
        placeX = p->pPlacement[2*pThis->Value+0] * nCols / (1<<16);
        placeY = p->pPlacement[2*pThis->Value+1] * nRows / (1<<16);
        assert( placeX < nCols && placeY < nRows );
        ppRows[placeY][placeX] = 1;
    }
    // select lines
    vLines = Vec_IntAlloc( 1000 );
    for ( i = 0; i < nRows; i++ )
    {
        fStart = 0;
        for ( k = 0; k <= nCols; k++ )
        {
            if ( ppRows[i][k] && !fStart )
            {
                Vec_IntPush( vLines, k );
                Vec_IntPush( vLines, i );
                fStart = 1;
            }
            if ( !ppRows[i][k] && fStart )
            {
                Vec_IntPush( vLines, k-1 );
                Vec_IntPush( vLines, i );
                fStart = 0;
            }
        }
        assert( fStart == 0 );
    }
    ABC_FREE( pBuffer );
    ABC_FREE( ppRows );
    return vLines;
}